

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O0

int sha224_init(hash_state *md)

{
  undefined8 *in_RDI;
  
  if (in_RDI == (undefined8 *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha2/sha224.c"
            ,0x2c);
  }
  *(undefined4 *)(in_RDI + 5) = 0;
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0xc1059ed8;
  *(undefined4 *)((long)in_RDI + 0xc) = 0x367cd507;
  *(undefined4 *)(in_RDI + 2) = 0x3070dd17;
  *(undefined4 *)((long)in_RDI + 0x14) = 0xf70e5939;
  *(undefined4 *)(in_RDI + 3) = 0xffc00b31;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0x68581511;
  *(undefined4 *)(in_RDI + 4) = 0x64f98fa7;
  *(undefined4 *)((long)in_RDI + 0x24) = 0xbefa4fa4;
  return 0;
}

Assistant:

int sha224_init(hash_state * md)
{
    LTC_ARGCHK(md != NULL);

    md->sha256.curlen = 0;
    md->sha256.length = 0;
    md->sha256.state[0] = 0xc1059ed8UL;
    md->sha256.state[1] = 0x367cd507UL;
    md->sha256.state[2] = 0x3070dd17UL;
    md->sha256.state[3] = 0xf70e5939UL;
    md->sha256.state[4] = 0xffc00b31UL;
    md->sha256.state[5] = 0x68581511UL;
    md->sha256.state[6] = 0x64f98fa7UL;
    md->sha256.state[7] = 0xbefa4fa4UL;
    return CRYPT_OK;
}